

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

Namespace *
flatbuffers::anon_unknown_0::GetNamespace
          (string *qualified_name,
          vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_> *namespaces,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
          *namespaces_index)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  undefined8 uVar1;
  char *pcVar2;
  Namespace *pNVar3;
  value_type local_90;
  long local_70;
  size_t pos;
  Namespace **ns;
  byte local_4a;
  allocator local_49;
  undefined1 local_48 [8];
  string namespace_name;
  size_t dot;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
  *namespaces_index_local;
  vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_> *namespaces_local;
  string *qualified_name_local;
  
  namespace_name.field_2._8_8_ = std::__cxx11::string::find_last_of((char)qualified_name,0x2e);
  local_4a = 0;
  ns._2_1_ = 0;
  if (namespace_name.field_2._8_8_ == -1) {
    std::allocator<char>::allocator();
    ns._2_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_48,"",(allocator<char> *)((long)&ns + 3));
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    uVar1 = namespace_name.field_2._8_8_;
    std::allocator<char>::allocator();
    local_4a = 1;
    std::__cxx11::string::string((string *)local_48,pcVar2,uVar1,&local_49);
  }
  if ((ns._2_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&ns + 3));
  }
  if ((local_4a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  pos = (size_t)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Namespace_*>_>_>
                ::operator[](namespaces_index,(key_type *)local_48);
  if (*(mapped_type *)pos == (mapped_type)0x0) {
    pNVar3 = (Namespace *)operator_new(0x20);
    Namespace::Namespace(pNVar3);
    *(Namespace **)pos = pNVar3;
    std::vector<flatbuffers::Namespace_*,_std::allocator<flatbuffers::Namespace_*>_>::push_back
              (namespaces,(value_type *)pos);
    local_70 = 0;
    while (namespace_name.field_2._8_8_ = std::__cxx11::string::find((char)qualified_name,0x2e),
          namespace_name.field_2._8_8_ != -1) {
      this = *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               **)pos;
      std::__cxx11::string::substr((ulong)&local_90,(ulong)qualified_name);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_70 = namespace_name.field_2._8_8_ + 1;
    }
    namespace_name.field_2._8_8_ = 0xffffffffffffffff;
  }
  pNVar3 = *(Namespace **)pos;
  std::__cxx11::string::~string((string *)local_48);
  return pNVar3;
}

Assistant:

static Namespace *GetNamespace(
    const std::string &qualified_name, std::vector<Namespace *> &namespaces,
    std::map<std::string, Namespace *> &namespaces_index) {
  size_t dot = qualified_name.find_last_of('.');
  std::string namespace_name = (dot != std::string::npos)
                                   ? std::string(qualified_name.c_str(), dot)
                                   : "";
  Namespace *&ns = namespaces_index[namespace_name];

  if (!ns) {
    ns = new Namespace();
    namespaces.push_back(ns);

    size_t pos = 0;

    for (;;) {
      dot = qualified_name.find('.', pos);
      if (dot == std::string::npos) { break; }
      ns->components.push_back(qualified_name.substr(pos, dot - pos));
      pos = dot + 1;
    }
  }

  return ns;
}